

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O2

void __thiscall nigel::AST_Parser::fillSFR(AST_Parser *this,shared_ptr<nigel::AstBlock> *block)

{
  element_type *peVar1;
  BasicType local_a0;
  char local_9c [4];
  shared_ptr<nigel::AstVariable> local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  local_88;
  value_type local_58;
  
  peVar1 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_9c[0] = '\0';
  local_9c[1] = '\0';
  local_9c[2] = '\0';
  local_9c[3] = '\0';
  local_a0 = 0x80;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            ((MemModel *)&local_98,&local_9c,(int *)"@P0",&local_a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[4],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_88,(char (*) [4])"@P0",&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair(&local_58.first,&local_88);
  local_58.second = 0;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_58.first);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar1 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_9c[0] = '\0';
  local_9c[1] = '\0';
  local_9c[2] = '\0';
  local_9c[3] = '\0';
  local_a0 = 0x90;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            ((MemModel *)&local_98,&local_9c,(int *)"@P1",&local_a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[4],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_88,(char (*) [4])"@P1",&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair(&local_58.first,&local_88);
  local_58.second = 0;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_58.first);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar1 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_9c[0] = '\0';
  local_9c[1] = '\0';
  local_9c[2] = '\0';
  local_9c[3] = '\0';
  local_a0 = 0xa0;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            ((MemModel *)&local_98,&local_9c,(int *)"@P2",&local_a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[4],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_88,(char (*) [4])"@P2",&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair(&local_58.first,&local_88);
  local_58.second = 0;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_58.first);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar1 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_9c[0] = '\0';
  local_9c[1] = '\0';
  local_9c[2] = '\0';
  local_9c[3] = '\0';
  local_a0 = 0xb0;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            ((MemModel *)&local_98,&local_9c,(int *)"@P3",&local_a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[4],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_88,(char (*) [4])"@P3",&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair(&local_58.first,&local_88);
  local_58.second = 0;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_58.first);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar1 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_9c[0] = '\0';
  local_9c[1] = '\0';
  local_9c[2] = '\0';
  local_9c[3] = '\0';
  local_a0 = 0x8a;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[5],int,nigel::BasicType>
            ((MemModel *)&local_98,(char (*) [5])local_9c,(int *)"@TL0",&local_a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[5],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_88,(char (*) [5])"@TL0",&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair(&local_58.first,&local_88);
  local_58.second = 0;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_58.first);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar1 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_9c[0] = '\0';
  local_9c[1] = '\0';
  local_9c[2] = '\0';
  local_9c[3] = '\0';
  local_a0 = 0x8b;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[5],int,nigel::BasicType>
            ((MemModel *)&local_98,(char (*) [5])local_9c,(int *)"@TH0",&local_a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[5],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_88,(char (*) [5])"@TH0",&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair(&local_58.first,&local_88);
  local_58.second = 0;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_58.first);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar1 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_9c[0] = '\0';
  local_9c[1] = '\0';
  local_9c[2] = '\0';
  local_9c[3] = '\0';
  local_a0 = 0x8c;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[5],int,nigel::BasicType>
            ((MemModel *)&local_98,(char (*) [5])local_9c,(int *)"@TL1",&local_a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[5],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_88,(char (*) [5])"@TL1",&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair(&local_58.first,&local_88);
  local_58.second = 0;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_58.first);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar1 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_9c[0] = '\0';
  local_9c[1] = '\0';
  local_9c[2] = '\0';
  local_9c[3] = '\0';
  local_a0 = 0x8d;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[5],int,nigel::BasicType>
            ((MemModel *)&local_98,(char (*) [5])local_9c,(int *)"@TH1",&local_a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[5],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_88,(char (*) [5])"@TH1",&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair(&local_58.first,&local_88);
  local_58.second = 0;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_58.first);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar1 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_9c[0] = '\0';
  local_9c[1] = '\0';
  local_9c[2] = '\0';
  local_9c[3] = '\0';
  local_a0 = 0x89;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            ((MemModel *)&local_98,(char (*) [6])local_9c,(int *)"@TMOD",&local_a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[6],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_88,(char (*) [6])"@TMOD",&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair(&local_58.first,&local_88);
  local_58.second = 0;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_58.first);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar1 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_9c[0] = '\0';
  local_9c[1] = '\0';
  local_9c[2] = '\0';
  local_9c[3] = '\0';
  local_a0 = 0x88;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            ((MemModel *)&local_98,(char (*) [6])local_9c,(int *)"@TCON",&local_a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[6],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_88,(char (*) [6])"@TCON",&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair(&local_58.first,&local_88);
  local_58.second = 0;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_58.first);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar1 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_9c[0] = '\0';
  local_9c[1] = '\0';
  local_9c[2] = '\0';
  local_9c[3] = '\0';
  local_a0 = 0xb8;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            ((MemModel *)&local_98,&local_9c,(int *)"@IP",&local_a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[4],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_88,(char (*) [4])"@IP",&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair(&local_58.first,&local_88);
  local_58.second = 0;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_58.first);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar1 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_9c[0] = '\0';
  local_9c[1] = '\0';
  local_9c[2] = '\0';
  local_9c[3] = '\0';
  local_a0 = 0xa8;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            ((MemModel *)&local_98,&local_9c,(int *)"@IE",&local_a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[4],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_88,(char (*) [4])"@IE",&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair(&local_58.first,&local_88);
  local_58.second = 0;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_58.first);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar1 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_9c[0] = '\0';
  local_9c[1] = '\0';
  local_9c[2] = '\0';
  local_9c[3] = '\0';
  local_a0 = 0x87;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            ((MemModel *)&local_98,(char (*) [6])local_9c,(int *)"@PCON",&local_a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[6],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_88,(char (*) [6])"@PCON",&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair(&local_58.first,&local_88);
  local_58.second = 0;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_58.first);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar1 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_9c[0] = '\0';
  local_9c[1] = '\0';
  local_9c[2] = '\0';
  local_9c[3] = '\0';
  local_a0 = 0x98;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            ((MemModel *)&local_98,(char (*) [6])local_9c,(int *)"@SCON",&local_a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[6],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_88,(char (*) [6])"@SCON",&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair(&local_58.first,&local_88);
  local_58.second = 0;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_58.first);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar1 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_9c[0] = '\0';
  local_9c[1] = '\0';
  local_9c[2] = '\0';
  local_9c[3] = '\0';
  local_a0 = 0x99;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            ((MemModel *)&local_98,(char (*) [6])local_9c,(int *)"@SBUF",&local_a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[6],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_88,(char (*) [6])"@SBUF",&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair(&local_58.first,&local_88);
  local_58.second = 0;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_58.first);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void AST_Parser::fillSFR( std::shared_ptr<AstBlock> block )
	{
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@P0", std::make_shared<AstVariable>( MemModel::fast, "@P0", 0x80, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@P1", std::make_shared<AstVariable>( MemModel::fast, "@P1", 0x90, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@P2", std::make_shared<AstVariable>( MemModel::fast, "@P2", 0xA0, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@P3", std::make_shared<AstVariable>( MemModel::fast, "@P3", 0xB0, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TL0", std::make_shared<AstVariable>( MemModel::fast, "@TL0", 0x8A, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TH0", std::make_shared<AstVariable>( MemModel::fast, "@TH0", 0x8B, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TL1", std::make_shared<AstVariable>( MemModel::fast, "@TL1", 0x8C, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TH1", std::make_shared<AstVariable>( MemModel::fast, "@TH1", 0x8D, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TMOD", std::make_shared<AstVariable>( MemModel::fast, "@TMOD", 0x89, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TCON", std::make_shared<AstVariable>( MemModel::fast, "@TCON", 0x88, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@IP", std::make_shared<AstVariable>( MemModel::fast, "@IP", 0xB8, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@IE", std::make_shared<AstVariable>( MemModel::fast, "@IE", 0xA8, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@PCON", std::make_shared<AstVariable>( MemModel::fast, "@PCON", 0x87, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@SCON", std::make_shared<AstVariable>( MemModel::fast, "@SCON", 0x98, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@SBUF", std::make_shared<AstVariable>( MemModel::fast, "@SBUF", 0x99, BasicType::tByte ) ), 0 ) );
	}